

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall
Clasp::UncoreMinimize::addK
          (UncoreMinimize *this,Solver *s,uint32 k,LitPair *lits,uint32 size,weight_t w)

{
  bool bVar1;
  Constraint **x_00;
  uint in_EDX;
  Solver *in_RSI;
  long in_RDI;
  uint in_R8D;
  __type_conflict _Var2;
  double dVar3;
  Result RVar4;
  Result res;
  uint32 i_3;
  uint32 i_2;
  uint32 flags;
  Literal ri;
  uint32 b;
  uint32 i_1;
  uint32 i;
  weight_t B;
  uint32 connect;
  uint32 n;
  Literal bin [2];
  Literal cp;
  uint32 idx;
  int x;
  bool concise;
  undefined4 in_stack_fffffffffffffe98;
  weight_t in_stack_fffffffffffffe9c;
  WCTemp *in_stack_fffffffffffffea0;
  Solver *in_stack_fffffffffffffea8;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_fffffffffffffeb0;
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *this_00;
  ConstraintInfo *in_stack_fffffffffffffeb8;
  Solver *in_stack_fffffffffffffec0;
  uint32 flags_00;
  WCTemp *in_stack_fffffffffffffec8;
  Solver *in_stack_fffffffffffffed0;
  Solver *in_stack_fffffffffffffee8;
  WeightLiteral *in_stack_fffffffffffffef0;
  Solver *in_stack_fffffffffffffef8;
  UncoreMinimize *this_01;
  UncoreMinimize *pUVar5;
  Solver *in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff20;
  uint uVar6;
  undefined8 in_stack_ffffffffffffff30;
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> local_b4;
  uint32 local_a0;
  uint32 local_9c;
  uint local_98;
  uint local_94;
  undefined4 local_90;
  uint32 local_8c;
  uint32 local_88;
  uint32 local_84;
  uint32 local_80;
  LitPair local_7c;
  uint32 local_74;
  uint local_70;
  uint local_6c;
  uint32 local_68;
  uint32 local_64;
  uint32 local_60;
  uint local_5c;
  uint32 local_58;
  int local_54;
  uint local_50;
  uint local_4c;
  undefined1 local_48 [12];
  uint local_3c;
  Literal local_38;
  byte local_31;
  uint local_2c;
  uint local_1c;
  Solver *local_18;
  
  local_2c = in_R8D;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_31 = OptParams::hasOption((OptParams *)(in_RDI + 0x104),usc_succinct);
  if (local_1c == 0) {
    if (local_2c < 9) {
      in_stack_ffffffffffffff20 = 1;
      uVar6 = in_stack_ffffffffffffff20;
    }
    else {
      in_stack_ffffffffffffff18 = (Solver *)(double)local_2c;
      _Var2 = std::log10<unsigned_int>(0);
      dVar3 = ceil((double)in_stack_ffffffffffffff18 / ((_Var2 * 16.0 + -2.0) / 2.0));
      in_stack_ffffffffffffff20 = (uint)dVar3;
      uVar6 = in_stack_ffffffffffffff20;
    }
  }
  else {
    uVar6 = (local_2c + (local_1c - 1)) / local_1c;
  }
  local_1c = (local_2c + (uVar6 - 1)) / uVar6;
  local_3c = 1;
  local_38.rep_ = uVar6;
  local_48._8_4_ =
       Literal::operator~((Literal *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  pUVar5 = (UncoreMinimize *)local_48;
  do {
    this_01 = pUVar5;
    Literal::Literal((Literal *)this_01);
    pUVar5 = (UncoreMinimize *)
             ((long)&(this_01->super_MinimizeConstraint).super_Constraint._vptr_Constraint + 4);
  } while (pUVar5 != (UncoreMinimize *)(local_48 + 8));
  while( true ) {
    local_4c = local_1c;
    local_50 = (uint)(local_3c + local_1c < local_2c);
    if (local_50 == 0) {
      local_4c = local_2c - local_3c;
    }
    local_54 = local_4c + local_50;
    WCTemp::start(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    local_58 = local_48._8_4_;
    WCTemp::add(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                (Literal)(uint32)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    for (local_5c = 0; local_5c != local_4c; local_5c = local_5c + 1) {
      in_stack_fffffffffffffef0 = (WeightLiteral *)(in_RDI + 0xb8);
      local_3c = local_3c + 1;
      in_stack_fffffffffffffef8 = local_18;
      local_60 = (uint32)Literal::operator~((Literal *)
                                            CONCAT44(in_stack_fffffffffffffe9c,
                                                     in_stack_fffffffffffffe98));
      WCTemp::add(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                  (Literal)(uint32)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    }
    if (local_50 != 0) {
      local_64 = (uint32)newLit((UncoreMinimize *)
                                CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                (Solver *)0x1b54bb);
      in_stack_fffffffffffffee8 = local_18;
      local_48._0_4_ = local_64;
      local_68 = (uint32)Literal::operator~((Literal *)
                                            CONCAT44(in_stack_fffffffffffffe9c,
                                                     in_stack_fffffffffffffe98));
      WCTemp::add(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                  (Literal)(uint32)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      local_48._8_4_ = local_48._0_4_;
    }
    local_70 = local_50;
    for (local_6c = 0; local_6c != local_4c; local_6c = local_6c + 1) {
      local_80 = (uint32)newLit((UncoreMinimize *)
                                CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                (Solver *)0x1b556c);
      local_7c = newAssumption((UncoreMinimize *)in_stack_fffffffffffffec0,
                               (Literal)(uint32)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                               (weight_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      local_74 = local_7c.lit.rep_;
      *(uint32 *)(local_48 + (ulong)local_70 * 4) = local_7c.lit.rep_;
      in_stack_fffffffffffffed0 = (Solver *)(in_RDI + 0xb8);
      local_84 = (uint32)Literal::operator~((Literal *)
                                            CONCAT44(in_stack_fffffffffffffe9c,
                                                     in_stack_fffffffffffffe98));
      WCTemp::add(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                  (Literal)(uint32)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      if (local_70 != 0) {
        local_88 = local_48._0_4_;
        local_8c = local_48._4_4_;
        addImplication((UncoreMinimize *)CONCAT44(uVar6,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff18,(Literal)(uint32)in_stack_ffffffffffffff30,
                       (Literal)(uint32)((ulong)in_RDI >> 0x20),SUB81((ulong)pUVar5 >> 0x38,0));
        local_48._0_4_ = local_48._4_4_;
      }
      local_70 = 1;
    }
    in_stack_fffffffffffffec0 = local_18;
    in_stack_fffffffffffffec8 = (WCTemp *)WCTemp::begin(in_stack_fffffffffffffea0);
    WCTemp::size((WCTemp *)0x1b56c7);
    bVar1 = addConstraint(this_01,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                          (uint32)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                          (weight_t)in_stack_fffffffffffffee8);
    if (!bVar1) break;
    if (local_3c == local_2c) {
      if (((local_31 & 1) == 0) && (bVar1 = Solver::hasConflict((Solver *)0x1b5729), !bVar1)) {
        local_90 = 0xb;
        for (local_94 = 0; local_94 != local_2c; local_94 = local_94 + 1) {
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (in_stack_fffffffffffffeb0,(Literal *)in_stack_fffffffffffffea8);
        }
        for (local_98 = 1; flags_00 = (uint32)((ulong)in_stack_fffffffffffffec0 >> 0x20),
            local_98 <= *(uint *)(in_RDI + 0xf8); local_98 = local_98 + 1) {
          in_stack_fffffffffffffeb8 = (ConstraintInfo *)(in_RDI + 0xa8);
          local_a0 = (uint32)Solver::decision(in_stack_fffffffffffffea8,
                                              (uint32)((ulong)in_stack_fffffffffffffea0 >> 0x20));
          local_9c = (uint32)Literal::operator~((Literal *)
                                                CONCAT44(in_stack_fffffffffffffe9c,
                                                         in_stack_fffffffffffffe98));
          bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                    (in_stack_fffffffffffffeb0,(Literal *)in_stack_fffffffffffffea8);
        }
        x_00 = (Constraint **)(in_RDI + 0xa8);
        this_00 = &local_b4;
        ConstraintInfo::ConstraintInfo((ConstraintInfo *)this_00,Other);
        RVar4 = ClauseCreator::create
                          (in_stack_fffffffffffffed0,(LitVec *)in_stack_fffffffffffffec8,flags_00,
                           in_stack_fffffffffffffeb8);
        local_b4.ebo_._4_8_ = RVar4.local;
        local_b4.ebo_.cap = RVar4.status;
        if ((ClauseHead *)local_b4.ebo_._4_8_ != (ClauseHead *)0x0) {
          bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::push_back
                    (this_00,x_00);
        }
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
                  ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0xa8));
      }
      bVar1 = Solver::hasConflict((Solver *)0x1b58ef);
      return (bool)((bVar1 ^ 0xffU) & 1);
    }
  }
  return false;
}

Assistant:

bool UncoreMinimize::addK(Solver& s, uint32 k, const LitPair* lits, uint32 size, weight_t w) {
	const bool concise = options_.hasOption(OptParams::usc_succinct);
	const int x = k ? (size + (k-1)) / k
	            : size <= 8 ? 1
	            : (int)std::ceil(size / (((std::log10(size)*16)-2)/2.0));
	k = (size + (x-1)) / x;
	uint32 idx = 1;
	Literal cp = ~lits[0].lit, bin[2];
	do {
		uint32 n = k, connect = uint32((idx + k) < size);
		if (!connect) {
			n = size - idx;
		}
		weight_t B = static_cast<weight_t>(n + connect);
		temp_.start(B);
		temp_.add(s, cp);
		for (uint32 i = 0; i != n; ++i) {
			temp_.add(s, ~lits[idx++].lit);
		}
		if (connect) {
			bin[0] = newLit(s);
			temp_.add(s, ~bin[0]);
			cp = bin[0];
		}
		for (uint32 i = 0, b = connect; i != n; ++i, b = 1) {
			Literal ri = newAssumption(newLit(s), w).lit;
			bin[b] = ri;
			temp_.add(s, ~ri);
			if (b) { // bin[0] -> bin[1];
				addImplication(s, bin[0], bin[1], concise);
				bin[0] = bin[1];
			}
		}
		if (!addConstraint(s, temp_.begin(), temp_.size(), temp_.bound)) {
			return false;
		}
	} while (idx != size);
	if (!concise && !s.hasConflict()) {
		typedef ClauseCreator::Result Result;
		const uint32 flags = ClauseCreator::clause_explicit | ClauseCreator::clause_not_root_sat | ClauseCreator::clause_no_add;
		for (uint32 i = 0; i != size; ++i)   { conflict_.push_back(lits[i].lit); }
		for (uint32 i = 1; i <= eRoot_; ++i) { conflict_.push_back(~s.decision(i)); }
		Result res = ClauseCreator::create(s, conflict_, flags, Constraint_t::Other);
		if (res.local) { closed_.push_back(res.local); }
		conflict_.clear();
	}
	return !s.hasConflict();
}